

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

int uv__process_open_stream(uv_stdio_container_t *container,int *pipefds)

{
  int iVar1;
  uint local_24;
  int err;
  int flags;
  int *pipefds_local;
  uv_stdio_container_t *container_local;
  
  if (((container->flags & UV_CREATE_PIPE) == UV_IGNORE) || (*pipefds < 0)) {
    container_local._4_4_ = 0;
  }
  else {
    iVar1 = uv__close(pipefds[1]);
    if (iVar1 != 0) {
      abort();
    }
    pipefds[1] = -1;
    uv__nonblock_ioctl(*pipefds,1);
    local_24 = 0;
    if ((container->flags & UV_WRITABLE_PIPE) != UV_IGNORE) {
      local_24 = 0x4000;
    }
    if ((container->flags & UV_READABLE_PIPE) != UV_IGNORE) {
      local_24 = local_24 | 0x8000;
    }
    container_local._4_4_ = uv__stream_open((container->data).stream,*pipefds,local_24);
  }
  return container_local._4_4_;
}

Assistant:

static int uv__process_open_stream(uv_stdio_container_t* container,
                                   int pipefds[2]) {
  int flags;
  int err;

  if (!(container->flags & UV_CREATE_PIPE) || pipefds[0] < 0)
    return 0;

  err = uv__close(pipefds[1]);
  if (err != 0)
    abort();

  pipefds[1] = -1;
  uv__nonblock(pipefds[0], 1);

  flags = 0;
  if (container->flags & UV_WRITABLE_PIPE)
    flags |= UV_HANDLE_READABLE;
  if (container->flags & UV_READABLE_PIPE)
    flags |= UV_HANDLE_WRITABLE;

  return uv__stream_open(container->data.stream, pipefds[0], flags);
}